

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

pool_ptr<soul::AST::Expression> __thiscall
soul::ResolutionPass::FunctionResolver::resolveFunction
          (FunctionResolver *this,PossibleFunction *f,CallOrCast *call,bool ignoreErrorsInGenerics)

{
  bool bVar1;
  Context *this_00;
  FunctionCall *o;
  undefined7 in_register_00000009;
  Identifier *extraout_RDX;
  Identifier *extraout_RDX_00;
  Identifier *args;
  byte in_R8B;
  bool local_75 [13];
  CompileMessage local_68;
  byte local_29;
  long lStack_28;
  bool ignoreErrorsInGenerics_local;
  CallOrCast *call_local;
  PossibleFunction *f_local;
  FunctionResolver *this_local;
  
  lStack_28 = CONCAT71(in_register_00000009,ignoreErrorsInGenerics);
  local_29 = in_R8B & 1;
  call_local = call;
  f_local = f;
  this_local = this;
  bVar1 = AST::Function::isRunFunction
                    ((Function *)
                     (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                     _vptr_ASTObject);
  args = extraout_RDX;
  if (!bVar1) {
    bVar1 = AST::Function::isUserInitFunction
                      ((Function *)
                       (call_local->super_CallOrCastBase).super_Expression.super_Statement.
                       super_ASTObject._vptr_ASTObject);
    args = extraout_RDX_00;
    if (!bVar1) {
      bVar1 = AST::Function::isGeneric
                        ((Function *)
                         (call_local->super_CallOrCastBase).super_Expression.super_Statement.
                         super_ASTObject._vptr_ASTObject);
      if (bVar1) {
        (**(code **)&f->function[2].super_ASTObject.objectType)
                  (this,f,lStack_28,
                   (call_local->super_CallOrCastBase).super_Expression.super_Statement.
                   super_ASTObject._vptr_ASTObject,local_29 & 1);
      }
      else {
        local_75[0] = false;
        o = AST::Allocator::
            allocate<soul::AST::FunctionCall,soul::AST::Context&,soul::AST::Function&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
                      (*(Allocator **)&f[1].isImpossible,(Context *)(lStack_28 + 0x10),
                       (Function *)
                       (call_local->super_CallOrCastBase).super_Expression.super_Statement.
                       super_ASTObject._vptr_ASTObject,
                       (pool_ptr<soul::AST::CommaSeparatedList> *)(lStack_28 + 0x30),local_75);
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::FunctionCall,void>
                  ((pool_ptr<soul::AST::Expression> *)this,o);
      }
      return (pool_ptr<soul::AST::Expression>)(Expression *)this;
    }
  }
  this_00 = (Context *)(lStack_28 + 0x10);
  Errors::cannotCallFunction<soul::Identifier&>
            (&local_68,
             (Errors *)
             ((call_local->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
              _vptr_ASTObject + 7),args);
  AST::Context::throwError(this_00,&local_68,false);
}

Assistant:

pool_ptr<AST::Expression> resolveFunction (const PossibleFunction& f, AST::CallOrCast& call, bool ignoreErrorsInGenerics)
        {
            if (f.function.isRunFunction() || f.function.isUserInitFunction())
                call.context.throwError (Errors::cannotCallFunction (f.function.name));

            if (f.function.isGeneric())
                return createCallToGenericFunction (call, f.function, ignoreErrorsInGenerics);

            return allocator.allocate<AST::FunctionCall> (call.context, f.function, call.arguments, false);
        }